

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::TestCase::swap(TestCase *this,TestCase *other)

{
  ITestCase *pIVar1;
  pointer pcVar2;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  size_t local_38;
  
  pIVar1 = (this->test).m_p;
  (this->test).m_p = (other->test).m_p;
  (other->test).m_p = pIVar1;
  std::__cxx11::string::swap((string *)&(this->super_TestCaseInfo).className);
  std::__cxx11::string::swap((string *)this);
  std::__cxx11::string::swap((string *)&(this->super_TestCaseInfo).description);
  pcVar2 = (this->super_TestCaseInfo).lineInfo.file._M_dataplus._M_p;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar2,
             pcVar2 + (this->super_TestCaseInfo).lineInfo.file._M_string_length);
  local_38 = (this->super_TestCaseInfo).lineInfo.line;
  std::__cxx11::string::_M_assign((string *)&(this->super_TestCaseInfo).lineInfo);
  (this->super_TestCaseInfo).lineInfo.line = (other->super_TestCaseInfo).lineInfo.line;
  std::__cxx11::string::_M_assign((string *)&(other->super_TestCaseInfo).lineInfo);
  (other->super_TestCaseInfo).lineInfo.line = local_38;
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  return;
}

Assistant:

void TestCase::swap( TestCase& other ) {
        test.swap( other.test );
        className.swap( other.className );
        name.swap( other.name );
        description.swap( other.description );
        std::swap( lineInfo, other.lineInfo );
    }